

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_pfx.cpp
# Opt level: O1

void Palette16R5G5B5(PalEntry *pal)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    *(ushort *)((long)&GPfxPal + lVar1) =
         (ushort)(*(byte *)((long)&pal->field_0 + lVar1 * 2) >> 3) |
         (*(byte *)((long)&pal->field_0 + lVar1 * 2 + 2) & 0xf8) * 0x80 +
         (*(byte *)((long)&pal->field_0 + lVar1 * 2 + 1) & 0xf8) * 4;
    lVar1 = lVar1 + 2;
  } while ((int)lVar1 != 0x200);
  return;
}

Assistant:

static void Palette16R5G5B5 (const PalEntry *pal)
{
	WORD *p16;
	int i;

	for (p16 = GPfxPal.Pal16, i = 256; i != 0; i--, pal++, p16++)
	{
		*p16 = ((pal->r << 7) & 0x7c00) |
			   ((pal->g << 2) & 0x03e0) |
			   ((pal->b >> 3) & 0x001f);
	}
}